

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

size_t asio::detail::
       buffer_size<__gnu_cxx::__normal_iterator<asio::const_buffer_const*,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>>
                 (const_buffer *param_1,undefined8 param_2)

{
  bool bVar1;
  reference pcVar2;
  size_t sVar3;
  const_buffer b;
  __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
  iter;
  size_t total_buffer_size;
  __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
  local_28;
  size_t local_20;
  undefined8 local_18;
  const_buffer *local_10;
  
  local_20 = 0;
  local_28._M_current = param_1;
  local_18 = param_2;
  local_10 = param_1;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
             ::operator*(&local_28);
    in_stack_ffffffffffffffc8 =
         (__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
          *)pcVar2->data_;
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
          *)pcVar2->size_;
    sVar3 = const_buffer::size((const_buffer *)&stack0xffffffffffffffc8);
    local_20 = sVar3 + local_20;
    __gnu_cxx::
    __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
    ::operator++(&local_28);
  }
  return local_20;
}

Assistant:

inline std::size_t buffer_size(multiple_buffers,
    Iterator begin, Iterator end) ASIO_NOEXCEPT
{
  std::size_t total_buffer_size = 0;

  Iterator iter = begin;
  for (; iter != end; ++iter)
  {
    const_buffer b(*iter);
    total_buffer_size += b.size();
  }

  return total_buffer_size;
}